

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_helpers.hpp
# Opt level: O2

void duckdb::HistogramGenericFunctor::PrepareData
               (Vector *input,idx_t count,Vector *extra_state,UnifiedVectorFormat *result)

{
  CreateSortKeyHelpers::CreateSortKey(input,count,(OrderModifiers)0x302,extra_state);
  Vector::Flatten(input,count);
  Vector::Flatten(extra_state,count);
  FlatVector::VerifyFlatVector(extra_state);
  FlatVector::VerifyFlatVector(input);
  TemplatedValidityMask<unsigned_long>::Initialize
            (&(extra_state->validity).super_TemplatedValidityMask<unsigned_long>,
             &(input->validity).super_TemplatedValidityMask<unsigned_long>);
  Vector::ToUnifiedFormat(extra_state,count,result);
  return;
}

Assistant:

static void PrepareData(Vector &input, idx_t count, Vector &extra_state, UnifiedVectorFormat &result) {
		OrderModifiers modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, extra_state);
		input.Flatten(count);
		extra_state.Flatten(count);
		FlatVector::Validity(extra_state).Initialize(FlatVector::Validity(input));
		extra_state.ToUnifiedFormat(count, result);
	}